

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O0

void nsync::nsync_mu_semaphore_v(nsync_semaphore *s)

{
  uint o;
  int iVar1;
  uint32_t old_value;
  futex *f;
  nsync_semaphore *s_local;
  
  do {
    o = std::atomic_load_explicit<unsigned_int>((atomic<unsigned_int> *)s,memory_order_relaxed);
    iVar1 = atm_cas_rel_u32_((nsync_atomic_uint32_ *)s,o,o + 1);
  } while (iVar1 == 0);
  iVar1 = futex((int *)s,0x81,1,(timespec *)0x0,(int *)0x0,0);
  if (iVar1 < 0) {
    uRam0000000000000000 = 0;
  }
  return;
}

Assistant:

void nsync_mu_semaphore_v (nsync_semaphore *s) {
	struct futex *f = (struct futex *) s;
        uint32_t old_value;
        do {    
                old_value = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
        } while (!ATM_CAS_REL ((nsync_atomic_uint32_ *) &f->i, old_value, old_value+1));
	ASSERT (futex (&f->i, FUTEX_WAKE_, 1, NULL, NULL, 0) >= 0);
}